

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

KINT32 __thiscall KDIS::NETWORK::Connection::SendPDU(Connection *this,Header *H)

{
  bool bVar1;
  KUINT16 KVar2;
  int iVar3;
  reference ppCVar4;
  KOCTET *pKVar5;
  undefined1 local_50 [8];
  KDataStream stream;
  iterator itrEnd;
  iterator itr;
  Header *H_local;
  Connection *this_local;
  
  itrEnd = std::
           vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
           ::begin(&this->m_vpSubscribers);
  stream._32_8_ =
       std::
       vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
       ::end(&this->m_vpSubscribers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&itrEnd,(__normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
                                *)&stream.m_ui16CurrentWritePos);
    if (!bVar1) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
              ::operator*(&itrEnd);
    (**(code **)(*(long *)*ppCVar4 + 0x20))(*ppCVar4,H);
    __gnu_cxx::
    __normal_iterator<KDIS::NETWORK::ConnectionSubscriber_**,_std::vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>_>
    ::operator++(&itrEnd);
  }
  KDataStream::KDataStream((KDataStream *)local_50,Big_Endian);
  (*(H->super_Header6)._vptr_Header6[5])(H,(KDataStream *)local_50);
  pKVar5 = KDataStream::GetBufferPtr((KDataStream *)local_50);
  KVar2 = KDataStream::GetBufferSize((KDataStream *)local_50);
  iVar3 = (*this->_vptr_Connection[0xd])(this,pKVar5,(ulong)KVar2);
  KDataStream::~KDataStream((KDataStream *)local_50);
  return iVar3;
}

Assistant:

KINT32 Connection::SendPDU(Header *H) noexcept(false)
{
    // First lets fire the events, then send the PDU.
    vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
    vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
    for( ; itr != itrEnd; ++itr )
    {
        ( *itr )->OnPDUTransmit( H );
    }

    // Now send the PDU
    KDataStream stream;
    H->Encode( stream );
    return Send( stream.GetBufferPtr(), stream.GetBufferSize() );
}